

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

bech32_bstring * bech32_create_bstring(size_t hrplen,size_t dplen)

{
  size_t sVar1;
  char *pcVar2;
  bech32_bstring *bstring;
  size_t dplen_local;
  size_t hrplen_local;
  
  if (hrplen == 0) {
    hrplen_local = 0;
  }
  else {
    hrplen_local = (size_t)malloc(0x10);
    if ((bech32_bstring *)hrplen_local == (bech32_bstring *)0x0) {
      hrplen_local = 0;
    }
    else {
      sVar1 = bech32_compute_encoded_string_length(hrplen,dplen);
      ((bech32_bstring *)hrplen_local)->length = sVar1;
      pcVar2 = (char *)calloc(((bech32_bstring *)hrplen_local)->length + 1,1);
      ((bech32_bstring *)hrplen_local)->string = pcVar2;
      if (((bech32_bstring *)hrplen_local)->string == (char *)0x0) {
        bech32_free_bstring((bech32_bstring *)hrplen_local);
        hrplen_local = 0;
      }
    }
  }
  return (bech32_bstring *)hrplen_local;
}

Assistant:

bech32_bstring * bech32_create_bstring(size_t hrplen, size_t dplen) {
    if(hrplen < 1)
        return nullptr;
    auto *bstring = static_cast<bech32_bstring *>(malloc(sizeof(bech32_bstring)));
    if(bstring == nullptr)
        return nullptr;
    bstring->length = bech32_compute_encoded_string_length(hrplen, dplen);
    bstring->string = static_cast<char *>(calloc(bstring->length + 1, 1)); // +1 for '\0'
    if(bstring->string == nullptr) {
        bech32_free_bstring(bstring);
        return nullptr;
    }
    return bstring;
}